

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall test_matrix_sparse_end_Test::TestBody(test_matrix_sparse_end_Test *this)

{
  size_t sVar1;
  initializer_list<double> value;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  bool bVar2;
  Scalar *pSVar3;
  char *pcVar4;
  size_t *psVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  AssertHelper local_2d8;
  Message local_2d0;
  undefined8 local_2c8;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> local_2c0;
  iterator local_2b0;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_5;
  Message local_278;
  undefined8 local_270;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> local_268;
  iterator local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_4;
  Message local_220;
  size_t local_218 [2];
  Matrix_Sparse_Row<Disa::Matrix_Sparse> local_208;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  iterator iter_const;
  Message local_1d0;
  undefined8 local_1c8;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> local_1c0;
  iterator local_1b0;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_2;
  Message local_178;
  undefined8 local_170;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> local_168;
  iterator local_158;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  Message local_120;
  size_t local_118 [3];
  undefined8 local_100;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> local_f8;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  iterator iter;
  pointer local_a8;
  undefined8 local_a0;
  pointer *local_98;
  undefined8 local_90;
  unsigned_long local_88 [3];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix;
  test_matrix_sparse_end_Test *this_local;
  
  local_88[0] = 0;
  local_88[1] = 1;
  local_88[2] = 2;
  local_70 = local_88;
  local_68 = 3;
  local_a8 = (pointer)0x1;
  local_a0 = 1;
  local_98 = &local_a8;
  local_90 = 2;
  iter.matrix_row.row_index = 0x3ff0000000000000;
  non_zero._M_len = 3;
  non_zero._M_array = local_70;
  index._M_len = 2;
  index._M_array = (iterator)local_98;
  value._M_len = 2;
  value._M_array = (iterator)&iter.matrix_row.row_index;
  matrix.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero,index,value,2);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)&gtest_ar.message_);
  local_100 = 0xffffffffffffffff;
  Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_f8,
             (difference_type *)&gtest_ar.message_);
  local_118[0] = 1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     (&local_f8,local_118);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_e8,"iter[-1][1]","2.0",*pSVar3,2.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_120);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_170 = 0xffffffffffffffff;
  Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_168,
             (difference_type *)&gtest_ar.message_);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin(&local_158,&local_168);
  psVar5 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_158);
  sVar1 = *psVar5;
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_138,"iter[-1].begin().i_row()","1",
             (auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_1c8 = 0xffffffffffffffff;
  Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_1c0,
             (difference_type *)&gtest_ar.message_);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin(&local_1b0,&local_1c0);
  psVar5 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_1b0);
  sVar1 = *psVar5;
  auVar7._8_4_ = (int)(sVar1 >> 0x20);
  auVar7._0_8_ = sVar1;
  auVar7._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_190,"iter[-1].begin().i_column()","1",
             (auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_1d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iter_const.matrix_row.row_index,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&iter_const.matrix_row.row_index,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iter_const.matrix_row.row_index)
    ;
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)&gtest_ar_3.message_);
  local_218[1] = 0xffffffffffffffff;
  Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_208,
             (difference_type *)&gtest_ar_3.message_);
  local_218[0] = 1;
  pSVar3 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     (&local_208,local_218);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1f8,"iter_const[-1][1]","2.0",*pSVar3,2.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar2) {
    testing::Message::Message(&local_220);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_270 = 0xffffffffffffffff;
  Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_268,
             (difference_type *)&gtest_ar_3.message_);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin(&local_258,&local_268);
  psVar5 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row(&local_258);
  sVar1 = *psVar5;
  auVar8._8_4_ = (int)(sVar1 >> 0x20);
  auVar8._0_8_ = sVar1;
  auVar8._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_238,"iter_const[-1].begin().i_row()","1",
             (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_2c8 = 0xffffffffffffffff;
  Disa::Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
            ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_2c0,
             (difference_type *)&gtest_ar_3.message_);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin(&local_2b0,&local_2c0);
  psVar5 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column(&local_2b0);
  sVar1 = *psVar5;
  auVar9._8_4_ = (int)(sVar1 >> 0x20);
  auVar9._0_8_ = sVar1;
  auVar9._12_4_ = 0x45300000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_290,"iter_const[-1].begin().i_column()","1",
             (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),1.0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, end) {
  Matrix_Sparse matrix({0, 1, 2}, {1, 1}, {1.0, 2.0}, 2);

  // These are more indirect checks, but essentially we should be looking at the last row's data.
  auto iter = matrix.end();
  EXPECT_DOUBLE_EQ(iter[-1][1], 2.0);
  EXPECT_DOUBLE_EQ(iter[-1].begin().i_row(), 1);
  EXPECT_DOUBLE_EQ(iter[-1].begin().i_column(), 1);

  auto iter_const = matrix.end();
  EXPECT_DOUBLE_EQ(iter_const[-1][1], 2.0);
  EXPECT_DOUBLE_EQ(iter_const[-1].begin().i_row(), 1);
  EXPECT_DOUBLE_EQ(iter_const[-1].begin().i_column(), 1);
}